

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::addedCols(SPxSolverBase<double> *this,int n)

{
  if (0 < n) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])(this);
    if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
      SPxBasisBase<double>::addedCols(&this->super_SPxBasisBase<double>,n);
      return;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::addedCols(int n)
{

   if(n > 0)
   {
      SPxLPBase<R>::addedCols(n);

      unInit();
      reDim();

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::addedCols(n);
   }

   /* we must not assert consistency here, since addedRows() might be still necessary to obtain a consistent basis */
}